

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall sptk::Matrix::Resize(Matrix *this,int num_row,int num_column)

{
  reference pvVar1;
  reference ppdVar2;
  int in_EDX;
  int in_ESI;
  Matrix *in_RDI;
  int i;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar4;
  
  iVar4 = in_ESI;
  if (in_ESI < 0) {
    iVar4 = 0;
  }
  in_RDI->num_row_ = iVar4;
  iVar3 = in_EDX;
  if (in_EDX < 0) {
    iVar3 = 0;
  }
  in_RDI->num_column_ = iVar3;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_ESI,in_EDX),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  std::vector<double_*,_std::allocator<double_*>_>::resize
            ((vector<double_*,_std::allocator<double_*>_> *)CONCAT44(in_ESI,in_EDX),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  Fill(in_RDI,(double)CONCAT44(iVar4,iVar3));
  for (iVar4 = 0; iVar4 < in_RDI->num_row_; iVar4 = iVar4 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&in_RDI->data_,(long)(iVar4 * in_RDI->num_column_));
    ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        (&in_RDI->index_,(long)iVar4);
    *ppdVar2 = pvVar1;
  }
  return;
}

Assistant:

void Matrix::Resize(int num_row, int num_column) {
  num_row_ = num_row < 0 ? 0 : num_row;
  num_column_ = num_column < 0 ? 0 : num_column;
  data_.resize(num_row_ * num_column_);
  index_.resize(num_row_);

  Fill(0.0);
  for (int i(0); i < num_row_; ++i) {
    index_[i] = &data_[i * num_column_];
  }
}